

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManUtilSkipComments(Prs_Man_t *p)

{
  int iVar1;
  Prs_Man_t *p_local;
  
  iVar1 = Prs_ManIsChar(p,'/');
  if (iVar1 != 0) {
    iVar1 = Prs_ManIsChar1(p,'/');
    if (iVar1 == 0) {
      iVar1 = Prs_ManIsChar1(p,'*');
      if (iVar1 != 0) {
        p->pCur = p->pCur + 2;
        while (p->pCur < p->pLimit) {
          iVar1 = Prs_ManIsChar(p,'*');
          if ((iVar1 != 0) && (iVar1 = Prs_ManIsChar1(p,'/'), iVar1 != 0)) {
            p->pCur = p->pCur + 1;
            p->pCur = p->pCur + 1;
            return 1;
          }
          p->pCur = p->pCur + 1;
        }
      }
    }
    else {
      p->pCur = p->pCur + 2;
      while (p->pCur < p->pLimit) {
        iVar1 = Prs_ManIsChar(p,'\n');
        if (iVar1 != 0) {
          p->pCur = p->pCur + 1;
          return 1;
        }
        p->pCur = p->pCur + 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Prs_ManUtilSkipComments( Prs_Man_t * p )
{
    if ( !Prs_ManIsChar(p, '/') )
        return 0;
    if ( Prs_ManIsChar1(p, '/') )
    {
        for ( p->pCur += 2; p->pCur < p->pLimit; p->pCur++ )
            if ( Prs_ManIsChar(p, '\n') )
                { p->pCur++; return 1; }
    }
    else if ( Prs_ManIsChar1(p, '*') )
    {
        for ( p->pCur += 2; p->pCur < p->pLimit; p->pCur++ )
            if ( Prs_ManIsChar(p, '*') && Prs_ManIsChar1(p, '/') )
                { p->pCur++; p->pCur++; return 1; }
    }
    return 0;
}